

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

string * extractFileName(string *__return_storage_ptr__,string *src)

{
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  allocator<char> local_59;
  undefined4 local_58;
  string local_48 [8];
  string rez;
  size_t i;
  size_t endPos;
  string *src_local;
  
  i = std::__cxx11::string::size();
  rez.field_2._8_8_ = std::__cxx11::string::size();
  do {
    while( true ) {
      if (rez.field_2._8_8_ == 0) {
        rez.field_2._8_8_ = rez.field_2._8_8_ + -1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",&local_59);
        std::allocator<char>::~allocator(&local_59);
        return __return_storage_ptr__;
      }
      rez.field_2._8_8_ = rez.field_2._8_8_ + -1;
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)src);
      if (*pcVar1 != '.') break;
      sVar2 = std::__cxx11::string::size();
      if (i == sVar2) {
        i = rez.field_2._8_8_;
      }
    }
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)src);
  } while ((*pcVar1 != '/') &&
          (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)src), *pcVar1 != '\\'));
  std::__cxx11::string::substr((ulong)local_48,(ulong)src);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::size();
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
    if (*pcVar1 == '\"') {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_48);
      goto LAB_00389b2a;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_48);
LAB_00389b2a:
  local_58 = 1;
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

string extractFileName(const string& src)
{
    size_t endPos = src.size();
    for (size_t i = src.size(); i-- > 0;)
        if (src[i] == '.')
        {
            if (endPos == src.size())
                endPos = i;
        }
        else if (src[i] == '/' || src[i] == '\\')
        {
            string rez = src.substr(i + 1, endPos - i - 1);
            if (!rez.empty() && rez[rez.size() - 1] == '\"')
                return rez.substr(0, rez.size() - 1);
            return rez;
        }
    return "";
}